

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O1

void init_ld_script(GlobalVars *gv)

{
  bool bVar1;
  char cVar2;
  uint16_t uVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  char *pcVar9;
  ObjectUnit *n;
  LinkedSection *ls;
  char *pcVar10;
  size_t sVar11;
  char *name;
  Section *n_00;
  Phdr **__ptr;
  Phdr *pPVar12;
  lword lVar13;
  char *pcVar14;
  MemoryDescr *vmreg;
  MemoryDescr *lmreg;
  lword lVar15;
  Phdr **ppPVar16;
  char *pcVar17;
  lword s_lma;
  lword s_addr;
  char namebuf [256];
  Phdr **local_168;
  char *local_150;
  lword local_148;
  lword local_140;
  undefined4 local_138;
  undefined3 uStack_134;
  
  if (gv->dest_object == 0) {
    scriptbase = gv->ldscript;
    if (scriptbase != (char *)0x0) goto LAB_00113748;
    lVar8 = 8;
  }
  else {
    if ((gv->dest_sharedobj == 0) || (scriptbase = gv->ldscript, scriptbase != (char *)0x0))
    goto LAB_00113748;
    lVar8 = 0x10;
  }
  scriptbase = *(char **)((long)&fff[gv->dest_format]->tname + lVar8);
LAB_00113748:
  if (scriptbase == (char *)0x0) {
    return;
  }
  preparse = 1;
  current_ls = (LinkedSection *)0x0;
  level = 0;
  defmem = add_memblock("default",0,0x7fffffffffffffff);
  vdefmem = defmem;
  ldefmem = defmem;
  atdefmem = add_memblock("lmadefault",0,0x7fffffffffffffff);
  change_address(defmem,gv->start_addr);
  scriptname = "built-in script";
  if (gv->scriptname != (char *)0x0) {
    scriptname = gv->scriptname;
  }
  snprintf((char *)&local_138,0x100,"Linker Script <%s>");
  pcVar9 = allocstring((char *)&local_138);
  n = art_objunit(gv,pcVar9,(uint8_t *)0x0,0);
  if (n != (ObjectUnit *)0x0) {
    n->flags = n->flags | 0x8001;
    addhead(&gv->selobjects,&n->n);
  }
  script_obj = n;
  init_parser(gv,scriptname,scriptbase,1);
  do {
    do {
      bVar1 = false;
LAB_00113876:
      while( true ) {
        while (pcVar9 = getarg('\x01'), pcVar9 == (char *)0x0) {
          cVar2 = getchr();
          if (cVar2 != ';') {
            if (cVar2 != '\0') {
              back(1);
              pcVar9 = scriptname;
              uVar6 = getlineno();
              error(0x4e,pcVar9,(ulong)uVar6);
            }
            preparse = 0;
            return;
          }
        }
        iVar4 = strcmp(pcVar9,"MEMORY");
        if (iVar4 == 0) break;
        iVar4 = strcmp(pcVar9,"PHDRS");
        if (iVar4 == 0) {
          gv->use_ldscript = 1;
          pcVar9 = scriptname;
          if (bVar1) {
            uVar6 = getlineno();
            error(100,pcVar9,(ulong)uVar6);
            skipblock(0,'{','}');
            bVar1 = true;
          }
          else {
            bVar5 = startofblock('{');
            if (bVar5 != 0) {
              pcVar9 = getarg('\x01');
              while (pcVar9 != (char *)0x0) {
                strcpy((char *)&local_138,pcVar9);
                pcVar10 = getarg('\x01');
                pcVar9 = scriptname;
                if (pcVar10 == (char *)0x0) {
                  uVar6 = getlineno();
                  error(0x4e,pcVar9,(ulong)uVar6);
LAB_00113fc2:
                  skipblock(1,'\0',';');
                }
                else {
                  iVar4 = strncmp(pcVar10,"PT_",3);
                  pcVar9 = scriptname;
                  if (iVar4 != 0) {
                    uVar6 = getlineno();
                    error(99,pcVar9,(ulong)uVar6);
                    goto LAB_00113fc2;
                  }
                  switch(pcVar10[3]) {
                  case 'I':
                    local_168._0_4_ = 3;
                    break;
                  case 'J':
                  case 'K':
                  case 'M':
                  case 'O':
                  case 'Q':
                  case 'R':
switchD_00113ff3_caseD_4a:
                    uVar6 = getlineno();
                    local_168._0_4_ = 0;
                    error(99,pcVar9,(ulong)uVar6,pcVar10);
                    break;
                  case 'L':
                    local_168._0_4_ = 1;
                    break;
                  case 'N':
                    local_168._0_4_ = 4;
                    break;
                  case 'P':
                    local_168._0_4_ = 6;
                    break;
                  case 'S':
                    local_168._0_4_ = 5;
                    break;
                  default:
                    if (pcVar10[3] != 'D') goto switchD_00113ff3_caseD_4a;
                    local_168._0_4_ = 2;
                  }
                  pcVar9 = getarg('\x01');
                  if (pcVar9 == (char *)0x0) {
                    lVar15 = -1;
                    uVar3 = 0;
                  }
                  else {
                    lVar15 = -1;
                    uVar6 = 0;
                    do {
                      iVar4 = strcmp(pcVar9,"FILEHDR");
                      if (iVar4 == 0) {
                        uVar6 = uVar6 | 0x800;
                      }
                      else {
                        iVar4 = strcmp(pcVar9,"PHDRS");
                        if (iVar4 == 0) {
                          uVar6 = uVar6 | 0x400;
                        }
                        else {
                          iVar4 = strcmp(pcVar9,"AT");
                          if (iVar4 == 0) {
                            lVar15 = term_absexp();
                            uVar6 = uVar6 | 0x80;
                          }
                          else {
                            iVar4 = strcmp(pcVar9,"FLAGS");
                            pcVar10 = scriptname;
                            if (iVar4 == 0) {
                              lVar13 = term_absexp();
                              uVar6 = uVar6 | (uint)lVar13 & 7 | 0x40;
                            }
                            else {
                              uVar7 = getlineno();
                              error(0x41,pcVar10,(ulong)uVar7,pcVar9);
                            }
                          }
                        }
                      }
                      uVar3 = (uint16_t)uVar6;
                      pcVar9 = getarg('\x01');
                    } while (pcVar9 != (char *)0x0);
                  }
                  cVar2 = getchr();
                  pcVar9 = scriptname;
                  if (cVar2 != ';') {
                    uVar6 = getlineno();
                    error(0x42,pcVar9,(ulong)uVar6);
                    if (cVar2 == '}') goto LAB_0011421d;
                  }
                  add_phdr(gv,(char *)&local_138,(uint32_t)local_168,uVar3,lVar15,(MemoryDescr *)0x0
                           ,(MemoryDescr *)0x0);
                }
                pcVar9 = getarg('\x01');
              }
              endofblock('{','}');
              pPVar12 = gv->phdrlist;
              if (pPVar12 != (Phdr *)0x0) {
                bVar1 = false;
                do {
                  if (pPVar12->type == 6) goto LAB_0011421d;
                  if ((pPVar12->flags & 0x400) != 0) {
                    bVar1 = true;
                  }
                  pPVar12 = pPVar12->next;
                } while (pPVar12 != (Phdr *)0x0);
                if (bVar1) {
                  add_phdr(gv," headers",6,0x400,-1,defmem,defmem);
                }
              }
            }
LAB_0011421d:
            bVar1 = false;
          }
        }
        else {
          iVar4 = strcmp(pcVar9,"SECTIONS");
          if (iVar4 == 0) {
            gv->use_ldscript = 1;
            pcVar9 = scriptname;
            if (bVar1) {
              uVar6 = getlineno();
              error(0x4a,pcVar9,(ulong)uVar6);
            }
            if (gv->phdrlist == (Phdr *)0x0) {
              add_phdr(gv," text",1,0x45,-1,defmem,defmem);
              add_phdr(gv," data",1,0x46,-1,defmem,defmem);
            }
            level = 1;
            bVar5 = startofblock('{');
            if (bVar5 != 0) {
              skip();
              secblkbase = gettxtptr();
              secblkline = getlineno();
              local_168 = (Phdr **)0x0;
              do {
                while( true ) {
                  pcVar9 = getarg('\x01');
                  if (pcVar9 == (char *)0x0) break;
                  iVar4 = check_command(gv,pcVar9,0x8002);
                  if (iVar4 == 0) {
                    cVar2 = getchr();
                    if (cVar2 == '=') {
                      symbol_assignment(gv,pcVar9,'\0');
                    }
                    else {
                      back(1);
                      pcVar9 = allocstring(pcVar9);
                      uVar6 = startofsecdef(&local_140,(char *)&local_138,&local_148);
                      if (uVar6 == 0) {
                        free(pcVar9);
                        pcVar9 = scriptname;
                        uVar6 = getlineno();
                        error(0x41,pcVar9,(ulong)uVar6);
                      }
                      else {
                        ls = create_lnksect(gv,pcVar9,'\0','\0','\0','\0',0);
                        if (CONCAT31(uStack_134,local_138._3_1_) == 0x44414f &&
                            local_138 == 0x4f4c4f4e) {
                          *(byte *)&ls->ld_flags = (byte)ls->ld_flags | 1;
                        }
                        if (3 < uVar6) {
                          ls->destmem = atdefmem;
                        }
                        new_ls_name = ls->name;
                        level = 2;
                        n_00 = (Section *)0x0;
                        do {
                          while (pcVar10 = getarg('\x05'), pcVar10 != (char *)0x0) {
                            iVar4 = check_command(gv,pcVar10,0x8002);
                            if (iVar4 == 0) {
                              cVar2 = getchr();
                              pcVar14 = scriptname;
                              if (cVar2 == '=') {
                                symbol_assignment(gv,pcVar10,'\0');
                              }
                              else if (cVar2 == '(') {
                                if (n_00 == (Section *)0x0) {
                                  pcVar10 = getarg('\x05');
                                  if (pcVar10 == (char *)0x0) {
                                    ierror("make_dummy_sec_from_pattern(): no pattern?");
                                  }
                                  sVar11 = strlen(pcVar10);
                                  name = (char *)alloc(sVar11 + 1);
                                  pcVar14 = name;
                                  while( true ) {
                                    do {
                                      pcVar17 = pcVar10;
                                      cVar2 = *pcVar17;
                                      pcVar10 = pcVar17 + 1;
                                    } while (cVar2 == '*');
                                    if (cVar2 == '\0') break;
                                    if (cVar2 == '[') {
                                      cVar2 = *pcVar10;
                                      if (cVar2 != '\0') {
                                        pcVar10 = pcVar17 + 2;
                                        *pcVar14 = cVar2;
                                        pcVar14 = pcVar14 + 1;
                                      }
                                      for (; (cVar2 = *pcVar10, cVar2 != '\0' && (cVar2 != ']'));
                                          pcVar10 = pcVar10 + 1) {
                                      }
                                      pcVar10 = pcVar10 + (cVar2 == ']');
                                    }
                                    else if (cVar2 == '?') {
                                      *pcVar14 = '_';
                                      pcVar14 = pcVar14 + 1;
                                    }
                                    else {
                                      *pcVar14 = cVar2;
                                      pcVar14 = pcVar14 + 1;
                                    }
                                  }
                                  *pcVar14 = '\0';
                                  n_00 = create_section(script_obj,name,(uint8_t *)0x0,0);
                                  n_00->lnksec = ls;
                                  addtail(&ls->sections,&n_00->n);
                                }
                                skipblock(1,'(',')');
                              }
                              else {
                                uVar6 = getlineno();
                                error(0x41,pcVar14,(ulong)uVar6);
                                back(1);
                              }
                            }
                          }
                          cVar2 = getchr();
                        } while (cVar2 == ';');
                        back(1);
                        level = 1;
                        new_ls_name = (char *)0x0;
                        __ptr = endofsecdef(gv,ls);
                        if (__ptr == (Phdr **)0x0) {
                          if (ls->relocmem == (MemoryDescr *)0x0) {
                            ls->relocmem = vdefmem;
                          }
                          if (ls->destmem == (MemoryDescr *)0x0) {
                            ls->destmem = ldefmem;
                          }
                        }
                        else {
                          if (ls->relocmem == (MemoryDescr *)0x0) {
                            ls->relocmem = vdefmem;
                          }
                          if (ls->destmem == (MemoryDescr *)0x0) {
                            ls->destmem = ldefmem;
                          }
                          if ((*__ptr == (Phdr *)0x0) && (local_168 != (Phdr **)0x0)) {
                            free(__ptr);
                            __ptr = local_168;
                          }
                          ppPVar16 = local_168;
                          if (((*__ptr != (Phdr *)0x0) &&
                              (ppPVar16 = __ptr, local_168 != (Phdr **)0x0)) && (__ptr != local_168)
                             ) {
                            free(local_168);
                          }
                          pPVar12 = *__ptr;
                          local_168 = ppPVar16;
                          if (pPVar12 == (Phdr *)0x0) {
                            if ((ls->relocmem == defmem) && (ls->destmem == defmem)) {
                              use_segment(gv," text",1,defmem,defmem);
                              pcVar10 = " data";
                              vmreg = defmem;
                              lmreg = defmem;
                            }
                            else {
                              pcVar10 = " load";
                              vmreg = ls->relocmem;
                              lmreg = ls->destmem;
                            }
                            use_segment(gv,pcVar10,1,vmreg,lmreg);
                            uVar3 = guess_special_segment(pcVar9,&local_150);
                            if (uVar3 != 0) {
                              use_segment(gv,local_150,(uint)uVar3,ls->relocmem,ls->destmem);
                            }
                          }
                          else {
                            do {
                              __ptr = __ptr + 1;
                              if (pPVar12->type != 0) {
                                *(byte *)&pPVar12->flags = (byte)pPVar12->flags | 0x10;
                              }
                              pPVar12 = *__ptr;
                            } while (pPVar12 != (Phdr *)0x0);
                          }
                        }
                      }
                    }
                  }
                }
                cVar2 = getchr();
              } while (cVar2 == ';');
              back(1);
              if (local_168 != (Phdr **)0x0) {
                free(local_168);
              }
              endofblock('{','}');
            }
            level = 0;
            bVar1 = true;
          }
          else {
            iVar4 = check_command(gv,pcVar9,2);
            if (iVar4 == 0) {
              cVar2 = getchr();
              pcVar10 = scriptname;
              if (cVar2 == '=') {
                symbol_assignment(gv,pcVar9,'\0');
              }
              else {
                uVar6 = getlineno();
                error(0x41,pcVar10,(ulong)uVar6);
                back(1);
              }
            }
          }
        }
      }
      gv->use_ldscript = 1;
      pcVar9 = scriptname;
      if (bVar1) {
        uVar6 = getlineno();
        error(100,pcVar9,(ulong)uVar6);
        skipblock(0,'{','}');
        bVar1 = true;
        goto LAB_00113876;
      }
      bVar5 = startofblock('{');
    } while (bVar5 == 0);
    pcVar9 = getarg('\x01');
    while (pcVar9 != (char *)0x0) {
      strcpy((char *)&local_138,pcVar9);
      cVar2 = getchr();
      if (cVar2 == '(') {
        skipblock(1,'(',')');
        cVar2 = getchr();
      }
      pcVar9 = scriptname;
      if (cVar2 == ':') {
        lVar15 = readmemparam(gv,"ORIGIN");
        cVar2 = getchr();
        pcVar9 = scriptname;
        if (cVar2 != ',') {
          uVar6 = getlineno();
          goto LAB_001142f9;
        }
        lVar13 = readmemparam(gv,"LENGTH");
        add_memblock((char *)&local_138,lVar15,lVar13);
      }
      else {
        uVar6 = getlineno();
LAB_001142f9:
        error(0x42,pcVar9,(ulong)uVar6);
      }
      pcVar9 = getarg('\x01');
    }
    endofblock('{','}');
  } while( true );
}

Assistant:

void init_ld_script(struct GlobalVars *gv)
{
  char c;

  if (!gv->dest_object) {
    scriptbase = gv->ldscript ? gv->ldscript :
                                fff[gv->dest_format]->exeldscript;
  }
  else if (gv->dest_sharedobj) {
    scriptbase = gv->ldscript ? gv->ldscript :
                                fff[gv->dest_format]->soldscript;
  }

  if (scriptbase) {
    bool secdef = FALSE;
    char *keyword;

    /* initialization */
    preparse = TRUE;
    current_ls = NULL;
    level = 0; /* outside SECTIONS block */
    defmem = vdefmem = ldefmem = add_memblock(defmemname,MEM_DEFORG,MEM_DEFLEN);
    atdefmem = add_memblock("lmadefault",MEM_DEFORG,MEM_DEFLEN);
    change_address(defmem,gv->start_addr);
    if (!(scriptname = gv->scriptname))
      scriptname = "built-in script";
    script_obj = make_ld_objunit(gv);

    /* pre-parse script: get memory-regions and symbol definitions */
    init_parser(gv,scriptname,scriptbase,1);

    do {
      while (keyword = getword()) {

        if (!strcmp(keyword,"MEMORY")) {
          gv->use_ldscript = TRUE;
          if (secdef == FALSE) {
            define_memory(gv);
          }
          else {
            /* MEMORY behind SECTIONS ignored */
            error(100,scriptname,getlineno(),keyword);
            skipblock(0,'{','}');
          }
        }

        else if (!strcmp(keyword,"PHDRS")) {
          gv->use_ldscript = TRUE;
          if (secdef == FALSE) {
            define_phdrs(gv);
          }
          else {
            /* PHDRS behind SECTIONS ignored */
            error(100,scriptname,getlineno(),keyword);
            skipblock(0,'{','}');
          }
        }

        else if (!strcmp(keyword,"SECTIONS")) {
          gv->use_ldscript = TRUE;
          if (secdef)
            error(74,scriptname,getlineno());  /* SECTIONS block def. twice */
          else
            secdef = TRUE;

          /* Define default PHDRs */
          if (gv->phdrlist == NULL) {
            add_phdr(gv,deftxt,PT_LOAD,PHDR_FLAGS|PF_X|PF_R,
                     ADDR_NONE,defmem,defmem);
            add_phdr(gv,defdat,PT_LOAD,PHDR_FLAGS|PF_R|PF_W,
                     ADDR_NONE,defmem,defmem);
          }
          level = 1;
          predefine_sections(gv);
          level = 0;
        }

        else {
          if (check_command(gv,keyword,SCMDF_GLOBAL)) {
            /* script-command executed */
            continue;
          }

          else if (getchr() == '=') {
            /* symbol assignment */
            symbol_assignment(gv,keyword,0);
          }

          else {
            /* unknown keyword ignored */
            error(65,scriptname,getlineno(),keyword);
            back(1);
          }
        }
      }
    }
    while ((c = getchr()) == ';');

    if (c) {
      back(1);
      error(78,scriptname,getlineno());   /* missing argument */
    }
    preparse = FALSE;
  }
}